

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O2

void __thiscall
QTabBarPrivate::calculateFirstLastVisible(QTabBarPrivate *this,int index,bool visible,bool remove)

{
  int i;
  int iVar1;
  uint uVar2;
  long lVar3;
  undefined7 in_register_00000011;
  ulong uVar5;
  ulong uVar4;
  
  iVar1 = this->firstVisible;
  if ((int)CONCAT71(in_register_00000011,visible) != 0) {
    if (index <= iVar1) {
      iVar1 = index;
    }
    this->firstVisible = iVar1;
    if (index < this->lastVisible) {
      index = this->lastVisible;
    }
    this->lastVisible = index;
    return;
  }
  if (iVar1 == index || remove) {
    this->firstVisible = -1;
    for (lVar3 = 0; (this->tabList).d.size != lVar3; lVar3 = lVar3 + 1) {
      if (((this->tabList).d.ptr[lVar3]->field_0xe4 & 2) != 0) {
        this->firstVisible = (int)lVar3;
        break;
      }
    }
  }
  if ((remove) || (this->lastVisible == index)) {
    this->lastVisible = -1;
    uVar4 = (this->tabList).d.size;
    uVar5 = uVar4 & 0xffffffff;
    while( true ) {
      uVar5 = uVar5 - 1;
      uVar2 = (int)uVar4 - 1;
      uVar4 = (ulong)uVar2;
      if ((int)uVar2 < 0) break;
      if (((this->tabList).d.ptr[(uint)uVar5 & 0x7fffffff]->field_0xe4 & 2) != 0) {
        this->lastVisible = uVar2;
        return;
      }
    }
  }
  return;
}

Assistant:

void QTabBarPrivate::calculateFirstLastVisible(int index, bool visible, bool remove)
{
    if (visible) {
        firstVisible = qMin(index, firstVisible);
        lastVisible  = qMax(index, lastVisible);
    } else {
        if (remove || (index == firstVisible)) {
            firstVisible = -1;
            for (int i = 0; i < tabList.size(); ++i) {
                if (tabList.at(i)->visible) {
                    firstVisible = i;
                    break;
                }
            }
        }
        if (remove || (index == lastVisible)) {
            lastVisible = -1;
            for (int i = tabList.size() - 1; i >= 0; --i) {
                if (tabList.at(i)->visible) {
                    lastVisible = i;
                    break;
                }
            }
        }
    }
}